

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericsort.c
# Opt level: O1

int numericsort(dirent **A,dirent **B,int cs)

{
  char *pcVar1;
  byte bVar2;
  ushort *puVar3;
  long lVar4;
  int iVar5;
  ushort **ppuVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uchar *puVar11;
  uchar *puVar12;
  
  puVar11 = (uchar *)(*A)->d_name;
  puVar12 = (uchar *)(*B)->d_name;
  ppuVar6 = __ctype_b_loc();
  puVar3 = *ppuVar6;
  while( true ) {
    uVar10 = 0;
    while( true ) {
      bVar2 = *puVar11;
      iVar9 = (int)(char)bVar2;
      if (((*(byte *)((long)puVar3 + (ulong)(uint)bVar2 * 2 + 1) & 8) == 0) ||
         ((*(byte *)((long)puVar3 + (ulong)*puVar12 * 2 + 1) & 8) == 0)) break;
      puVar11 = puVar11 + -1;
      do {
        pcVar1 = (char *)(puVar11 + 1);
        puVar11 = puVar11 + 1;
      } while (*pcVar1 == 0x30);
      puVar12 = puVar12 + -1;
      do {
        pcVar1 = (char *)(puVar12 + 1);
        puVar12 = puVar12 + 1;
      } while (*pcVar1 == 0x30);
      bVar2 = *puVar11;
      while (((*(byte *)((long)puVar3 + (ulong)bVar2 * 2 + 1) & 8) != 0 && (bVar2 == *puVar12))) {
        puVar12 = puVar12 + 1;
        pcVar1 = (char *)(puVar11 + 1);
        puVar11 = puVar11 + 1;
        bVar2 = *pcVar1;
      }
      uVar7 = 0;
      uVar8 = 0;
      if (((*(byte *)((long)puVar3 + (ulong)bVar2 * 2 + 1) & 8) != 0) &&
         (uVar8 = (int)(char)bVar2 - (int)(char)*puVar12,
         (*(byte *)((long)puVar3 + (ulong)*puVar12 * 2 + 1) & 8) == 0)) {
        uVar8 = 0;
      }
      if ((*(byte *)((long)puVar3 + (ulong)*puVar11 * 2 + 1) & 8) != 0) {
        uVar7 = 0;
        do {
          lVar4 = uVar7 + 1;
          uVar7 = uVar7 + 1;
        } while ((*(byte *)((long)puVar3 + (ulong)puVar11[lVar4] * 2 + 1) & 8) != 0);
        puVar11 = puVar11 + uVar7;
      }
      bVar2 = *puVar12;
      while (iVar5 = (int)uVar7, (*(byte *)((long)puVar3 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
        uVar7 = (ulong)(iVar5 - 1);
        bVar2 = puVar12[1];
        puVar12 = puVar12 + 1;
      }
      if (uVar8 != 0) {
        uVar10 = (ulong)uVar8;
      }
      if (iVar5 != 0) {
        uVar10 = uVar7 & 0xffffffff;
      }
      iVar9 = (int)uVar10;
      if (iVar5 != 0 || uVar8 != 0) goto LAB_001fb00c;
    }
    if (cs == 0) {
      iVar9 = tolower((uint)bVar2);
      iVar5 = tolower((uint)*puVar12);
    }
    else {
      iVar5 = (int)(char)*puVar12;
    }
    iVar9 = iVar9 - iVar5;
    if (iVar9 != 0) goto LAB_001fb00c;
    if (bVar2 == 0) break;
    puVar11 = puVar11 + 1;
    puVar12 = puVar12 + 1;
  }
  iVar9 = 0;
LAB_001fb00c:
  uVar8 = iVar9 >> 0x1f | 1;
  if (iVar9 == 0) {
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

static int numericsort(struct dirent **A, struct dirent **B, int cs) {
  const char* a = (*A)->d_name;
  const char* b = (*B)->d_name;
  int ret = 0;
  for (;;) {
    if (isdigit(*a & 255) && isdigit(*b & 255)) {
      int diff,magdiff;
      while (*a == '0') a++;
      while (*b == '0') b++;
      while (isdigit(*a & 255) && *a == *b) {a++; b++;}
      diff = (isdigit(*a & 255) && isdigit(*b & 255)) ? *a - *b : 0;
      magdiff = 0;
      while (isdigit(*a & 255)) {magdiff++; a++;}
      while (isdigit(*b & 255)) {magdiff--; b++;}
      if (magdiff) {ret = magdiff; break;} /* compare # of significant digits*/
      if (diff) {ret = diff; break;}	/* compare first non-zero digit */
    } else {
      if (cs) {
      	/* compare case-sensitive */
	if ((ret = *a-*b)) break;
      } else {
	/* compare case-insensitve */
	if ((ret = tolower(*a & 255)-tolower(*b & 255))) break;
      }

      if (!*a) break;
      a++; b++;
    }
  }
  if (!ret) return 0;
  else return (ret < 0) ? -1 : 1;
}